

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  undefined8 uVar4;
  SDL_Window *pSVar5;
  function<void_(int,_int)> *pfVar6;
  anon_class_24_3_f3b38634 *__f;
  uint in_EDI;
  bool isInitialized;
  void *gl_context;
  SDL_Window *window;
  SDL_WindowFlags window_flags;
  char *windowTitle;
  int windowY;
  int windowX;
  int playbackId;
  int captureId;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  argm;
  size_t *in_stack_fffffffffffffdf8;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  function<void_(int,_int)> *this;
  key_type *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  int local_19c;
  int local_16c;
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [32];
  int local_a8;
  byte local_a3;
  byte local_a2;
  allocator local_a1;
  string local_a0 [55];
  allocator local_69;
  string local_68 [36];
  int local_44;
  undefined1 local_40 [60];
  int local_4;
  
  local_4 = 0;
  parseCmdArguments_abi_cxx11_((int)local_40,(char **)(ulong)in_EDI);
  std::allocator<char>::allocator();
  local_a2 = 0;
  local_a3 = 0;
  std::__cxx11::string::string(local_68,"c",&local_69);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               in_stack_fffffffffffffe38);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::allocator<char>::allocator();
    local_a2 = 1;
    std::__cxx11::string::string(local_a0,"c",&local_a1);
    local_a3 = 1;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                 in_stack_fffffffffffffe38);
    local_16c = std::__cxx11::stoi((string *)
                                   CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                                   in_stack_fffffffffffffdf8,0);
  }
  else {
    local_16c = 0;
  }
  if ((local_a3 & 1) != 0) {
    std::__cxx11::string::~string(local_a0);
  }
  if ((local_a2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_44 = local_16c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"p",&local_c9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               in_stack_fffffffffffffe38);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"p",&local_f1);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                 in_stack_fffffffffffffe38);
    local_19c = std::__cxx11::stoi((string *)
                                   CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                                   in_stack_fffffffffffffdf8,0);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  }
  else {
    local_19c = 0;
  }
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  local_a8 = local_19c;
  iVar2 = SDL_Init(0x20);
  __stream = _stderr;
  if (iVar2 == 0) {
    ImGui_PreInit();
    pSVar5 = (SDL_Window *)SDL_CreateWindow("spectrogram",0x2fff0000,0x2fff0000,0x640,0x4b0,0x2022);
    pfVar6 = (function<void_(int,_int)> *)SDL_GL_CreateContext(pSVar5);
    this = pfVar6;
    SDL_GL_MakeCurrent(pSVar5,pfVar6);
    SDL_GL_SetSwapInterval(1);
    ImGui_Init(pSVar5,pfVar6);
    __f = (anon_class_24_3_f3b38634 *)ImGui::GetIO();
    __f[1].playbackId = (int *)0x0;
    ImGui_SetStyle();
    ImGui_NewFrame(pSVar5);
    ImGui::Render();
    std::function<bool()>::operator=((function<bool_()> *)this,__f);
    std::function<void(int,int)>::operator=(this,(anon_class_8_1_722fcd2e *)__f);
    std::function<bool()>::operator=((function<bool_()> *)this,(anon_class_16_2_9aebbfdd *)__f);
    bVar1 = std::function<bool_()>::operator()
                      ((function<bool_()> *)
                       CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
    if (bVar1) {
      do {
        in_stack_fffffffffffffe07 =
             std::function<bool_()>::operator()
                       ((function<bool_()> *)
                        CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
      } while ((bool)in_stack_fffffffffffffe07);
      GGWave_deinit();
      ImGui_Shutdown();
      ImGui::DestroyContext((ImGuiContext *)0x0);
      SDL_GL_DeleteContext(pfVar6);
      SDL_DestroyWindow(pSVar5);
      SDL_CloseAudio();
      SDL_Quit();
      local_4 = 0;
    }
    else {
      printf("Error: failed to initialize audio\n");
      local_4 = -2;
    }
  }
  else {
    uVar4 = SDL_GetError();
    fprintf(__stream,"Error: %s\n",uVar4);
    local_4 = -1;
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x10a7bf);
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
#ifdef __EMSCRIPTEN__
    printf("Build time: %s\n", BUILD_TIMESTAMP);
    printf("Press the Init button to start\n");

    if (argv[1]) {
        GGWave_setDefaultCaptureDeviceName(argv[1]);
    }
#endif

    auto argm = parseCmdArguments(argc, argv);
    int captureId = argm["c"].empty() ? 0 : std::stoi(argm["c"]);
    int playbackId = argm["p"].empty() ? 0 : std::stoi(argm["p"]);

    if (SDL_Init(SDL_INIT_VIDEO) != 0) {
        fprintf(stderr, "Error: %s\n", SDL_GetError());
        return -1;
    }

    ImGui_PreInit();

    int windowX = 1600;
    int windowY = 1200;

    const char * windowTitle = "spectrogram";

#ifdef __EMSCRIPTEN__
    SDL_Renderer * renderer;
    SDL_Window * window;
    SDL_CreateWindowAndRenderer(windowX, windowY, SDL_WINDOW_OPENGL, &window, &renderer);
#else
    SDL_WindowFlags window_flags = (SDL_WindowFlags)(SDL_WINDOW_OPENGL | SDL_WINDOW_RESIZABLE | SDL_WINDOW_ALLOW_HIGHDPI);
    SDL_Window * window = SDL_CreateWindow(windowTitle, SDL_WINDOWPOS_CENTERED, SDL_WINDOWPOS_CENTERED, windowX, windowY, window_flags);
#endif

    void * gl_context = SDL_GL_CreateContext(window);

    SDL_GL_MakeCurrent(window, gl_context);
    SDL_GL_SetSwapInterval(1); // Enable vsync

    ImGui_Init(window, gl_context);
    ImGui::GetIO().IniFilename = nullptr;

    ImGui_SetStyle();

    ImGui_NewFrame(window);
    ImGui::Render();

    bool isInitialized = false;

    g_doInit = [&]() {
        if (GGWave_init(playbackId, captureId) == false) {
            fprintf(stderr, "Failed to initialize GGWave\n");
            return false;
        }

        g_freqDataSize = (3*GGWave::kDefaultSampleRate)/g_nSamplesPerFrame;

        float df = float(GGWave::kDefaultSampleRate)/g_nSamplesPerFrame;
        g_freqData.resize(g_nSamplesPerFrame/2);
        for (int i = 0; i < g_nSamplesPerFrame/2; ++i) {
            g_freqData[i].freq = df*i;
            g_freqData[i].mag.resize(g_freqDataSize);
        }

        isInitialized = true;

        return true;
    };

    g_setWindowSize = [&](int sizeX, int sizeY) {
        SDL_SetWindowSize(window, sizeX, sizeY);
    };

    g_mainUpdate = [&]() {
        if (isInitialized == false) {
            return true;
        }

        if (ImGui_BeginFrame(window) == false) {
            return false;
        }

        const auto& displaySize = ImGui::GetIO().DisplaySize;

        ImGui::SetNextWindowPos({ 0, 0, });
        ImGui::SetNextWindowSize(displaySize);
        ImGui::Begin("Main", nullptr,
                     ImGuiWindowFlags_NoMove |
                     ImGuiWindowFlags_NoTitleBar |
                     ImGuiWindowFlags_NoScrollbar |
                     ImGuiWindowFlags_NoResize |
                     ImGuiWindowFlags_NoScrollWithMouse |
                     ImGuiWindowFlags_NoSavedSettings);

        auto & style = ImGui::GetStyle();

        auto itemSpacingSave = style.ItemSpacing;
        style.ItemSpacing.x = 0.0f;
        style.ItemSpacing.y = 0.0f;

        auto windowPaddingSave = style.WindowPadding;
        style.WindowPadding.x = 0.0f;
        style.WindowPadding.y = 0.0f;

        auto childBorderSizeSave = style.ChildBorderSize;
        style.ChildBorderSize = 0.0f;

        {
            float sum = 0.0;
            for (int i = g_binMin; i < g_binMax; ++i) {
                for (int j = 0; j < g_freqDataSize; ++j) {
                    sum += g_freqData[i].mag[j];
                }
            }

            int nf = g_binMax - g_binMin;
            sum /= (nf*g_freqDataSize);

            const auto wSize = ImGui::GetContentRegionAvail();

            const float dx = wSize.x/nf;
            const float dy = wSize.y/g_freqDataSize;

            auto p0 = ImGui::GetCursorScreenPos();

            int nChildWindows = 0;
            int nFreqPerChild = 32;
            ImGui::PushID(nChildWindows++);
            ImGui::BeginChild("Spectrogram", { wSize.x, (nFreqPerChild + 1)*dy }, true);
            auto drawList = ImGui::GetWindowDrawList();

            for (int j = 0; j < g_freqDataSize; ++j) {
                if (j > 0 && j % nFreqPerChild == 0) {
                    ImGui::EndChild();
                    ImGui::PopID();

                    ImGui::PushID(nChildWindows++);
                    ImGui::SetCursorScreenPos({ p0.x, p0.y + nFreqPerChild*int(j/nFreqPerChild)*dy });
                    ImGui::BeginChild("Spectrogram", { wSize.x, (nFreqPerChild + 1)*dy }, true);
                    drawList = ImGui::GetWindowDrawList();
                }
                for (int i = 0; i < nf; ++i) {
                    int k = g_freqDataHead + j;
                    if (k >= g_freqDataSize) k -= g_freqDataSize;
                    auto v = g_freqData[g_binMin + i].mag[k];
                    ImVec4 c = { 0.0f, 1.0f, 0.0, 0.0f };
                    c.w = v/(g_scale*sum);

                    const ImVec2 rp0 = { p0.x + i*dx     , p0.y + j*dy };
                    const ImVec2 rp1 = { p0.x + i*dx + dx, p0.y + j*dy + dy };

                    drawList->AddRectFilled(rp0, rp1, ImGui::ColorConvertFloat4ToU32(c));

                    // if hovering -> tooltip
                    if (ImGui::IsMouseHoveringRect(rp0, rp1)) {
                        ImGui::BeginTooltip();
                        ImGui::Text("%.2f Hz", g_freqData[g_binMin + i].freq);
                        ImGui::Text("%.2f", v);
                        ImGui::EndTooltip();
                    }
                }
            }

            ImGui::EndChild();
            ImGui::PopID();
        }

        style.ItemSpacing = itemSpacingSave;
        style.WindowPadding = windowPaddingSave;
        style.ChildBorderSize = childBorderSizeSave;

        ImGui::End();

        bool togglePause = false;

        if (g_showControls) {
            ImGui::SetNextWindowFocus();
            ImGui::SetNextWindowPos({ std::max(20.0f, displaySize.x - 400.0f - 20.0f), 20.0f });
            ImGui::SetNextWindowSize({ std::min(displaySize.x - 40.0f, 400.0f), 210.0f });
            ImGui::Begin("Controls", &g_showControls);
            ImGui::Text("Press 'c' to hide/show this window");
            {
                static char buf[64];
                snprintf(buf, 64, "Bin: %3d, Freq: %5.2f Hz", g_binMin, 0.5*g_binMin*g_obtainedSpecInp.freq/g_nBins);
                ImGui::DragInt("Min", &g_binMin, 1, 0, g_binMax - 2, buf);
                snprintf(buf, 64, "Bin: %3d, Freq: %5.2f Hz", g_binMax, 0.5*g_binMax*g_obtainedSpecInp.freq/g_nBins);
                ImGui::DragInt("Max", &g_binMax, 1, g_binMin + 1, g_nBins, buf);
            }
            ImGui::DragFloat("Scale", &g_scale, 1.0f, 1.0f, 1000.0f);

            if (ImGui::Checkbox("High-pass", &g_filter2)) {
            }
            ImGui::SameLine();
            if (ImGui::Checkbox("Hann", &g_filter0)) {
            }
            ImGui::SameLine();
            if (ImGui::Checkbox("Hamming", &g_filter1)) {
            }

            ImGui::Text("%s", "");
#ifndef __EMSCRIPTEN__
            if (ImGui::SliderFloat("Offset", &g_sampleRateOffset, -2048, 2048)) {
                GGWave_deinit();
                GGWave_init(0, 0);
            }
#endif
            if (ImGui::Button("Pause [Enter]")) {
                togglePause = true;
            }
            if (ImGui::IsKeyPressed(40)) {
                togglePause = true;
            }
            ImGui::End();
        }

        if (togglePause) {
            g_isCapturing = !g_isCapturing;
        }

        if (ImGui::IsKeyPressed(6)) {
            g_showControls = !g_showControls;
        }

        GGWave_mainLoop();

        ImGui_EndFrame(window);

        return true;
    };

#ifdef __EMSCRIPTEN__
    emscripten_set_main_loop_arg(mainUpdate, NULL, 60, true);
#else
    if (g_doInit() == false) {
        printf("Error: failed to initialize audio\n");
        return -2;
    }

    while (true) {
        if (g_mainUpdate() == false) break;
    }

    GGWave_deinit();

    // Cleanup
    ImGui_Shutdown();
    ImGui::DestroyContext();

    SDL_GL_DeleteContext(gl_context);
    SDL_DestroyWindow(window);
    SDL_CloseAudio();
    SDL_Quit();
#endif

    return 0;
}